

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicNotify
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          AtomicNotify *curr)

{
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Address memorySize_00;
  Literal *pLVar3;
  Literal local_158;
  address64_t local_140;
  address64_t local_138;
  address64_t local_130;
  Literal local_128;
  Address local_110;
  Address addr;
  Address memorySize;
  undefined1 local_d8 [8];
  MemoryInstanceInfo info;
  Flow count;
  undefined1 local_68 [8];
  Flow ptr;
  AtomicNotify *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar2,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar2,
               *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x20));
    bVar1 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_d8,this,
                 (Name)((IString *)(ptr.breakTo.super_IString.str._M_str + 0x28))->str);
      addr.addr = (address64_t)info.instance;
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,memory);
      curr_00 = ptr.breakTo.super_IString.str._M_str;
      this_00 = local_d8;
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal(&local_128,pLVar3);
      local_130 = memorySize_00.addr;
      local_110 = getFinalAddress<wasm::AtomicNotify>
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,(AtomicNotify *)curr_00
                             ,&local_128,4,memorySize_00);
      ::wasm::Literal::~Literal(&local_128);
      local_138 = local_110.addr;
      local_140 = memorySize_00.addr;
      checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,local_110,4,memorySize_00)
      ;
      wasm::Literal::Literal(&local_158,0);
      Flow::Flow(__return_storage_ptr__,&local_158);
      ::wasm::Literal::~Literal(&local_158);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicNotify(AtomicNotify* curr) {
    NOTE_ENTER("AtomicNotify");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto count = self()->visit(curr->notifyCount);
    NOTE_EVAL1(count);
    if (count.breaking()) {
      return count;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), 4, memorySize);
    // Just check TODO actual threads support
    info.instance->checkAtomicAddress(addr, 4, memorySize);
    return Literal(int32_t(0)); // none woken up
  }